

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

int enet_protocol_send_reliable_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *position;
  undefined8 *puVar3;
  short *psVar4;
  byte bVar5;
  ushort uVar6;
  ulong uVar7;
  _ENetListNode *p_Var8;
  _ENetListNode *p_Var9;
  _ENetListNode *p_Var10;
  _ENetListNode *p_Var11;
  _ENetListNode *p_Var12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  void *data;
  byte bVar18;
  long lVar19;
  uint uVar20;
  _ENetListNode *p_Var21;
  _ENetListNode *position_00;
  long lVar22;
  long lVar23;
  
  lVar19 = host->commandCount * 0x32 + 0x6c;
  lVar22 = host->bufferCount * 0x10 + 0x6b8;
  pEVar2 = &peer->outgoingReliableCommands;
  p_Var21 = (peer->outgoingReliableCommands).sentinel.next;
  if (p_Var21 == &pEVar2->sentinel) {
    iVar16 = 1;
LAB_001073dc:
    host->commandCount = (lVar19 + -0x6c >> 1) * -0x70a3d70a3d70a3d7;
    host->bufferCount = lVar22 + -0x6b8 >> 4;
    return iVar16;
  }
  position = &peer->sentReliableCommands;
  bVar13 = false;
  bVar14 = false;
  iVar15 = 1;
LAB_00107153:
  iVar16 = iVar15;
  position_00 = p_Var21;
  do {
    bVar5 = *(byte *)((long)&position_00[2].previous + 1);
    if ((ulong)bVar5 < peer->channelCount) {
      lVar23 = (long)peer->channels->reliableWindows + ((ulong)((uint)bVar5 * 0x50) - 6);
    }
    else {
      lVar23 = 0;
    }
    uVar6 = *(ushort *)&position_00[1].next;
    bVar5 = (byte)(uVar6 >> 8);
    if ((lVar23 == 0) ||
       ((!bVar13 &&
        ((bVar13 = false, (uVar6 & 0xfff) != 0 || *(short *)((long)&position_00[2].next + 6) != 0 ||
         ((*(ushort *)(lVar23 + 6 + (ulong)((uVar6 >> 0xc) - 1 & 0xf) * 2) < 0x1000 &&
          (bVar18 = bVar5 >> 4,
          ((0xffU >> (0x10 - bVar18 & 0x1f) | 0xff << bVar18) & (uint)*(ushort *)(lVar23 + 4)) == 0)
          ))))))) {
      if (position_00[6].next == (_ENetListNode *)0x0) goto LAB_0010722c;
      if (!bVar14) {
        uVar20 = peer->windowSize * peer->packetThrottle >> 5;
        if (uVar20 <= peer->mtu) {
          uVar20 = peer->mtu;
        }
        if ((uint)*(ushort *)((long)&position_00[2].next + 4) + peer->reliableDataInTransit <=
            uVar20) break;
      }
      position_00 = position_00->next;
      bVar14 = true;
    }
    else {
      position_00 = position_00->next;
      bVar13 = true;
    }
    if (position_00 == &pEVar2->sentinel) goto LAB_001073dc;
  } while( true );
  bVar14 = false;
LAB_0010722c:
  if ((lVar19 < 0x6ac) && (lVar22 < 0xab8)) {
    uVar7 = commandSizes[*(byte *)&position_00[2].previous & 0xf];
    uVar17 = (ulong)peer->mtu - host->packetSize;
    if ((uVar7 <= uVar17) &&
       ((position_00[6].next == (_ENetListNode *)0x0 ||
        ((uint)(ushort)(*(short *)((long)&position_00[2].next + 4) + (short)uVar7) <=
         ((uint)uVar17 & 0xffff))))) {
      p_Var21 = position_00->next;
      if ((lVar23 != 0) && (*(short *)((long)&position_00[2].next + 6) == 0)) {
        *(ushort *)(lVar23 + 4) = *(ushort *)(lVar23 + 4) | (ushort)(1 << (bVar5 >> 4));
        psVar4 = (short *)(lVar23 + 6 + (ulong)(uint)(uVar6 >> 0xc) * 2);
        *psVar4 = *psVar4 + 1;
      }
      psVar4 = (short *)((long)&position_00[2].next + 6);
      *psVar4 = *psVar4 + 1;
      if (*(int *)&position_00[1].previous == 0) {
        iVar15 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
        *(int *)&position_00[1].previous = iVar15;
        *(enet_uint32 *)((long)&position_00[1].previous + 4) = iVar15 * peer->timeoutLimit;
      }
      if ((position->sentinel).next == &position->sentinel) {
        peer->nextTimeout = *(int *)&position_00[1].previous + host->serviceTime;
      }
      puVar3 = (undefined8 *)((long)host->commands + lVar19 + -0x6c);
      data = enet_list_remove(position_00);
      enet_list_insert(&position->sentinel,data);
      *(enet_uint32 *)((long)&position_00[1].next + 4) = host->serviceTime;
      *(undefined8 **)((long)host->commands + lVar22 + -0x6c) = puVar3;
      *(ulong *)((long)host->commands + lVar22 + -100) = uVar7;
      host->packetSize = host->packetSize + uVar7;
      pbVar1 = (byte *)((long)&host->headerFlags + 3);
      *pbVar1 = *pbVar1 | 8;
      *(undefined2 *)(puVar3 + 6) = *(undefined2 *)&position_00[5].previous;
      p_Var8 = position_00[2].previous;
      p_Var9 = position_00[3].next;
      p_Var10 = position_00[3].previous;
      p_Var11 = position_00[4].next;
      p_Var12 = position_00[5].next;
      puVar3[4] = position_00[4].previous;
      puVar3[5] = p_Var12;
      puVar3[2] = p_Var10;
      puVar3[3] = p_Var11;
      *puVar3 = p_Var8;
      puVar3[1] = p_Var9;
      lVar23 = lVar22;
      if (position_00[6].next != (_ENetListNode *)0x0) {
        lVar23 = lVar22 + 0x10;
        *(ulong *)((long)host->commands + lVar22 + -0x5c) =
             (long)&(position_00[6].next[1].next)->next + (ulong)*(uint *)&position_00[2].next;
        uVar6 = *(ushort *)((long)&position_00[2].next + 4);
        *(ulong *)((long)host->commands + lVar22 + -0x54) = (ulong)uVar6;
        host->packetSize = host->packetSize + (ulong)uVar6;
        peer->reliableDataInTransit = peer->reliableDataInTransit + (uint)uVar6;
      }
      peer->packetsSent = peer->packetsSent + 1;
      lVar19 = lVar19 + 0x32;
      lVar22 = lVar23 + 0x10;
      iVar16 = 0;
      iVar15 = 0;
      if (p_Var21 == &pEVar2->sentinel) goto LAB_001073dc;
      goto LAB_00107153;
    }
  }
  host->continueSending = 1;
  iVar16 = 0;
  goto LAB_001073dc;
}

Assistant:

static int
enet_protocol_send_reliable_outgoing_commands (ENetHost * host, ENetPeer * peer)
{
    ENetProtocol * command = & host -> commands [host -> commandCount];
    ENetBuffer * buffer = & host -> buffers [host -> bufferCount];
    ENetOutgoingCommand * outgoingCommand;
    ENetListIterator currentCommand;
    ENetChannel *channel;
    enet_uint16 reliableWindow;
    size_t commandSize;
    int windowExceeded = 0, windowWrap = 0, canPing = 1;

    currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
    
    while (currentCommand != enet_list_end (& peer -> outgoingReliableCommands))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;

       channel = outgoingCommand -> command.header.channelID < peer -> channelCount ? & peer -> channels [outgoingCommand -> command.header.channelID] : NULL;
       reliableWindow = outgoingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel != NULL)
       {
           if (! windowWrap &&      
               outgoingCommand -> sendAttempts < 1 && 
               ! (outgoingCommand -> reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
               (channel -> reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                 channel -> usedReliableWindows & ((((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) << reliableWindow) | 
                   (((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
             windowWrap = 1;
          if (windowWrap)
          {
             currentCommand = enet_list_next (currentCommand);
 
             continue;
          }
       }
 
       if (outgoingCommand -> packet != NULL)
       {
          if (! windowExceeded)
          {
             enet_uint32 windowSize = (peer -> packetThrottle * peer -> windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;
             
             if (peer -> reliableDataInTransit + outgoingCommand -> fragmentLength > ENET_MAX (windowSize, peer -> mtu))
               windowExceeded = 1;
          }
          if (windowExceeded)
          {
             currentCommand = enet_list_next (currentCommand);

             continue;
          }
       }

       canPing = 0;

       commandSize = commandSizes [outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK];
       if (command >= & host -> commands [sizeof (host -> commands) / sizeof (ENetProtocol)] ||
           buffer + 1 >= & host -> buffers [sizeof (host -> buffers) / sizeof (ENetBuffer)] ||
           peer -> mtu - host -> packetSize < commandSize ||
           (outgoingCommand -> packet != NULL && 
             (enet_uint16) (peer -> mtu - host -> packetSize) < (enet_uint16) (commandSize + outgoingCommand -> fragmentLength)))
       {
          host -> continueSending = 1;
          
          break;
       }

       currentCommand = enet_list_next (currentCommand);

       if (channel != NULL && outgoingCommand -> sendAttempts < 1)
       {
          channel -> usedReliableWindows |= 1 << reliableWindow;
          ++ channel -> reliableWindows [reliableWindow];
       }

       ++ outgoingCommand -> sendAttempts;
 
       if (outgoingCommand -> roundTripTimeout == 0)
       {
          outgoingCommand -> roundTripTimeout = peer -> roundTripTime + 4 * peer -> roundTripTimeVariance;
          outgoingCommand -> roundTripTimeoutLimit = peer -> timeoutLimit * outgoingCommand -> roundTripTimeout;
       }

       if (enet_list_empty (& peer -> sentReliableCommands))
         peer -> nextTimeout = host -> serviceTime + outgoingCommand -> roundTripTimeout;

       enet_list_insert (enet_list_end (& peer -> sentReliableCommands),
                         enet_list_remove (& outgoingCommand -> outgoingCommandList));

       outgoingCommand -> sentTime = host -> serviceTime;

       buffer -> data = command;
       buffer -> dataLength = commandSize;

       host -> packetSize += buffer -> dataLength;
       host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;

       * command = outgoingCommand -> command;

       if (outgoingCommand -> packet != NULL)
       {
          ++ buffer;
          
          buffer -> data = outgoingCommand -> packet -> data + outgoingCommand -> fragmentOffset;
          buffer -> dataLength = outgoingCommand -> fragmentLength;

          host -> packetSize += outgoingCommand -> fragmentLength;

          peer -> reliableDataInTransit += outgoingCommand -> fragmentLength;
       }

       ++ peer -> packetsSent;
        
       ++ command;
       ++ buffer;
    }

    host -> commandCount = command - host -> commands;
    host -> bufferCount = buffer - host -> buffers;

    return canPing;
}